

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O3

void __thiscall QToolBarLayout::updateGeomArray(QToolBarLayout *this)

{
  Representation *pRVar1;
  long *plVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Orientation OVar9;
  int iVar10;
  Orientation OVar11;
  QSizePolicy QVar12;
  QWidget *pQVar13;
  QStyle *pQVar14;
  undefined8 uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  pointer pQVar19;
  ulong uVar20;
  byte bVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  QSize *pQVar26;
  QSize *pQVar27;
  int iVar28;
  long in_FS_OFFSET;
  QMargins QVar29;
  QStyleOptionToolBar opt;
  int local_11c;
  QArrayDataPointer<QLayoutStruct> local_b8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dirty == true) {
    QLayout::parentWidget(&this->super_QLayout);
    pQVar13 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
    if (pQVar13 != (QWidget *)0x0) {
      pQVar14 = QWidget::style(pQVar13);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_98);
      (**(code **)(*(long *)pQVar13 + 0x1a0))(pQVar13,(QStyleOptionToolBar *)local_98);
      bVar4 = movable(this);
      iVar6 = 0;
      if (bVar4) {
        iVar6 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x35,local_98,pQVar13);
      }
      QVar29 = QLayout::contentsMargins(&this->super_QLayout);
      iVar7 = (**(code **)(*(long *)&this->super_QLayout + 0x60))(this);
      iVar8 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x39,local_98,pQVar13);
      OVar9 = QToolBar::orientation((QToolBar *)pQVar13);
      bVar4 = OVar9 != Vertical;
      (this->hint).wd = 0;
      (this->hint).ht = 0;
      (this->minSize).wd = 0;
      (this->minSize).ht = 0;
      iVar10 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x35,local_98,pQVar13);
      (&(this->minSize).wd)[bVar4].m_i = iVar10;
      iVar10 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x35,local_98,pQVar13);
      (&(this->hint).wd)[bVar4].m_i = iVar10;
      this->expanding = false;
      this->empty = false;
      local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
      QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)&local_b8,(this->items).d.size + 1);
      if ((this->items).d.size == 0) {
        bVar4 = true;
      }
      else {
        lVar24 = 0;
        uVar20 = 0;
        local_11c = 0;
        do {
          plVar2 = *(long **)((long)(this->items).d.ptr + lVar24);
          uVar15 = (**(code **)(*plVar2 + 0x20))(plVar2);
          uVar16 = (**(code **)(*plVar2 + 0x18))(plVar2);
          uVar17 = (**(code **)(*plVar2 + 0x10))(plVar2);
          OVar11 = (**(code **)(*plVar2 + 0x28))(plVar2);
          bVar5 = (bool)(**(code **)(*plVar2 + 0x40))(plVar2);
          this->expanding = (bool)(this->expanding | (OVar11 & OVar9) != 0);
          lVar18 = (**(code **)(*plVar2 + 0x68))(plVar2);
          if (lVar18 != 0) {
            pQVar13 = (QWidget *)(**(code **)(*plVar2 + 0x68))(plVar2);
            QVar12 = QWidget::sizePolicy(pQVar13);
            if (((uint)QVar12.field_0 >> 0x11 & 1) != 0) {
              this->expandFlag = true;
            }
          }
          iVar10 = (int)(uVar16 >> 0x20);
          if (bVar5 == false) {
            iVar23 = iVar7;
            if (local_11c == 0) {
              iVar23 = iVar10;
              if (OVar9 == Horizontal) {
                iVar23 = (int)uVar16;
              }
              pRVar1 = &(this->minSize).wd + (OVar9 != Horizontal);
              pRVar1->m_i = pRVar1->m_i + iVar23;
              iVar23 = 0;
            }
            iVar22 = (int)(uVar17 >> 0x20);
            if (OVar9 == Vertical) {
              iVar22 = (int)uVar17;
            }
            uVar3 = uVar16 >> 0x20;
            if (OVar9 == Vertical) {
              uVar3 = uVar16;
            }
            pQVar26 = (QSize *)&(this->hint).ht;
            if (OVar9 == Vertical) {
              pQVar26 = &this->hint;
            }
            pQVar27 = (QSize *)&(this->minSize).ht;
            if (OVar9 == Vertical) {
              pQVar27 = &this->minSize;
            }
            iVar28 = (pQVar27->wd).m_i;
            iVar25 = (int)uVar3;
            if ((int)uVar3 < iVar28) {
              iVar25 = iVar28;
            }
            (&(this->minSize).wd)[bVar4].m_i = iVar25;
            uVar3 = uVar17 >> 0x20;
            if (OVar9 == Horizontal) {
              uVar3 = uVar17;
            }
            iVar28 = (int)uVar3;
            pRVar1 = &(this->hint).wd + (OVar9 != Horizontal);
            pRVar1->m_i = pRVar1->m_i + iVar23 + iVar28;
            iVar23 = (pQVar26->wd).m_i;
            if (iVar22 < iVar23) {
              iVar22 = iVar23;
            }
            (&(this->hint).wd)[bVar4].m_i = iVar22;
            local_11c = local_11c + 1;
          }
          else {
            uVar3 = uVar17 >> 0x20;
            if (OVar9 == Horizontal) {
              uVar3 = uVar17;
            }
            iVar28 = (int)uVar3;
          }
          pQVar19 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          (&pQVar19->sizeHint)[lVar24] = iVar28;
          pQVar19 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          iVar23 = (int)((ulong)uVar15 >> 0x20);
          if (OVar9 == Horizontal) {
            iVar23 = (int)uVar15;
          }
          (&pQVar19->maximumSize)[lVar24] = iVar23;
          if (OVar9 == Horizontal) {
            iVar10 = (int)uVar16;
          }
          pQVar19 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          (&pQVar19->minimumSize)[lVar24] = iVar10;
          pQVar19 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          (&pQVar19->expansive)[lVar24 * 4] = (OVar11 & OVar9) != 0;
          pQVar13 = (QWidget *)(**(code **)(*plVar2 + 0x68))(plVar2);
          QVar12 = QWidget::sizePolicy(pQVar13);
          bVar21 = QVar12.field_0._1_1_;
          if (OVar9 == Horizontal) {
            bVar21 = QVar12.field_0._0_1_;
          }
          pQVar19 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          (&pQVar19->stretch)[lVar24] = (uint)bVar21;
          pQVar19 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          (&pQVar19->empty)[lVar24 * 4] = bVar5;
          uVar20 = uVar20 + 1;
          lVar24 = lVar24 + 8;
        } while (uVar20 < (ulong)(this->items).d.size);
        bVar4 = local_11c == 0;
      }
      QArrayDataPointer<QLayoutStruct>::operator=(&(this->geomArray).d,&local_b8);
      this->empty = bVar4;
      bVar4 = OVar9 != Horizontal;
      pRVar1 = &(this->minSize).wd + bVar4;
      pRVar1->m_i = pRVar1->m_i + iVar6;
      iVar10 = QVar29.m_right.m_i.m_i + QVar29.m_left.m_i.m_i;
      (this->minSize).wd.m_i = (this->minSize).wd.m_i + iVar10;
      iVar23 = QVar29.m_bottom.m_i.m_i + QVar29.m_top.m_i.m_i;
      pRVar1 = &(this->minSize).ht;
      pRVar1->m_i = pRVar1->m_i + iVar23;
      if (1 < (ulong)(this->items).d.size) {
        pRVar1 = &(this->minSize).wd + bVar4;
        pRVar1->m_i = pRVar1->m_i + iVar8 + iVar7;
      }
      pRVar1 = &(this->hint).wd + bVar4;
      pRVar1->m_i = pRVar1->m_i + iVar6;
      (this->hint).wd.m_i = (this->hint).wd.m_i + iVar10;
      pRVar1 = &(this->hint).ht;
      pRVar1->m_i = pRVar1->m_i + iVar23;
      this->dirty = false;
      if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d)->super_QArrayData,0x20,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::updateGeomArray() const
{
    if (!dirty)
        return;

    QToolBarLayout *that = const_cast<QToolBarLayout*>(this);

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();

    that->minSize = QSize(0, 0);
    that->hint = QSize(0, 0);
    rperp(o, that->minSize) = style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb);
    rperp(o, that->hint) = style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb);

    that->expanding = false;
    that->empty = false;

    QList<QLayoutStruct> a(items.size() + 1); // + 1 for the stretch

    int count = 0;
    for (int i = 0; i < items.size(); ++i) {
        QToolBarItem *item = items.at(i);

        QSize max = item->maximumSize();
        QSize min = item->minimumSize();
        QSize hint = item->sizeHint();
        Qt::Orientations exp = item->expandingDirections();
        bool empty = item->isEmpty();

        that->expanding = expanding || exp & o;


        if (item->widget()) {
            if ((item->widget()->sizePolicy().horizontalPolicy() & QSizePolicy::ExpandFlag)) {
                that->expandFlag = true;
            }
        }

        if (!empty) {
            if (count == 0) // the minimum size only displays one widget
                rpick(o, that->minSize) += pick(o, min);
            int s = perp(o, minSize);
            rperp(o, that->minSize) = qMax(s, perp(o, min));

            //we only add spacing before item (ie never before the first one)
            rpick(o, that->hint) += (count == 0 ? 0 : spacing) + pick(o, hint);
            s = perp(o, that->hint);
            rperp(o, that->hint) = qMax(s, perp(o, hint));
            ++count;
        }

        a[i].sizeHint = pick(o, hint);
        a[i].maximumSize = pick(o, max);
        a[i].minimumSize = pick(o, min);
        a[i].expansive = exp & o;
        if (o == Qt::Horizontal)
            a[i].stretch = item->widget()->sizePolicy().horizontalStretch();
        else
            a[i].stretch = item->widget()->sizePolicy().verticalStretch();
        a[i].empty = empty;
    }

    that->geomArray = a;
    that->empty = count == 0;

    rpick(o, that->minSize) += handleExtent;
    that->minSize += QSize(pick(Qt::Horizontal, margins), pick(Qt::Vertical, margins));
    if (items.size() > 1)
        rpick(o, that->minSize) += spacing + extensionExtent;

    rpick(o, that->hint) += handleExtent;
    that->hint += QSize(pick(Qt::Horizontal, margins), pick(Qt::Vertical, margins));
    that->dirty = false;
}